

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void __thiscall QString::reallocData(QString *this,qsizetype alloc,AllocationOption option)

{
  Data *pDVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char16_t> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc == 0) {
    local_48.d = (Data *)0x0;
    local_48.ptr = &_empty;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_48);
  }
  else {
    pDVar1 = (this->d).d;
    if (((pDVar1 != (Data *)0x0) &&
        (pcVar3 = (this->d).ptr,
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) &&
       (pcVar2 = (char16_t *)
                 ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0),
       pcVar3 == pcVar2 || (long)pcVar3 - (long)pcVar2 < 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QtPrivate::QPodArrayOps<char16_t>::reallocate((QPodArrayOps<char16_t> *)this,alloc,option);
        return;
      }
      goto LAB_00322ae5;
    }
    lVar4 = (this->d).size;
    if (alloc <= lVar4) {
      lVar4 = alloc;
    }
    local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar3 = (char16_t *)QArrayData::allocate2(&local_30,alloc,option);
    local_48.d = (Data *)local_30;
    local_48.ptr = pcVar3;
    local_48.size = lVar4;
    if (pcVar3 == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
      goto LAB_00322ae5;
    }
    if (0 < lVar4) {
      memcpy(pcVar3,(this->d).ptr,lVar4 * 2);
    }
    pcVar3[lVar4] = L'\0';
    QArrayDataPointer<char16_t>::operator=(&this->d,&local_48);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00322ae5:
  __stack_chk_fail();
}

Assistant:

void QString::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size * sizeof(QChar));
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}